

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_199c2b::SwiftCompilerShellCommand::constructCommandLineArgs
          (SwiftCompilerShellCommand *this,StringRef outputFileMapPath,
          vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *result)

{
  pointer *ppSVar1;
  pointer pbVar2;
  iterator iVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *nameAndAlias;
  pointer pbVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg;
  StringRef local_50;
  StringRef local_40;
  
  local_40.Length = outputFileMapPath.Length;
  local_40.Data = outputFileMapPath.Data;
  local_50.Data = (this->executable)._M_dataplus._M_p;
  local_50.Length = (this->executable)._M_string_length;
  iVar3._M_current =
       (result->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar3._M_current ==
      (result->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::
    _M_realloc_insert<llvm::StringRef>(result,iVar3,&local_50);
    iVar3._M_current =
         (result->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    (iVar3._M_current)->Data = local_50.Data;
    (iVar3._M_current)->Length = local_50.Length;
    iVar3._M_current =
         (result->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (result->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  local_50.Data = "-module-name";
  local_50.Length = 0xc;
  if (iVar3._M_current ==
      (result->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::
    _M_realloc_insert<llvm::StringRef>(result,iVar3,&local_50);
    iVar3._M_current =
         (result->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    (iVar3._M_current)->Data = "-module-name";
    (iVar3._M_current)->Length = 0xc;
    iVar3._M_current =
         (result->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (result->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  local_50.Data = (this->moduleName)._M_dataplus._M_p;
  local_50.Length = (this->moduleName)._M_string_length;
  if (iVar3._M_current ==
      (result->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::
    _M_realloc_insert<llvm::StringRef>(result,iVar3,&local_50);
  }
  else {
    (iVar3._M_current)->Data = local_50.Data;
    (iVar3._M_current)->Length = local_50.Length;
    ppSVar1 = &(result->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>).
               _M_impl.super__Vector_impl_data._M_finish;
    *ppSVar1 = *ppSVar1 + 1;
  }
  pbVar4 = (this->moduleAliases).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (this->moduleAliases).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar4 != pbVar2) {
    do {
      local_50.Data = "-module-alias";
      local_50.Length = 0xd;
      iVar3._M_current =
           (result->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (result->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::
        _M_realloc_insert<llvm::StringRef>(result,iVar3,&local_50);
        iVar3._M_current =
             (result->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl
             .super__Vector_impl_data._M_finish;
      }
      else {
        (iVar3._M_current)->Data = "-module-alias";
        (iVar3._M_current)->Length = 0xd;
        iVar3._M_current =
             (result->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl
             .super__Vector_impl_data._M_finish + 1;
        (result->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
        super__Vector_impl_data._M_finish = iVar3._M_current;
      }
      local_50.Data = (pbVar4->_M_dataplus)._M_p;
      local_50.Length = pbVar4->_M_string_length;
      if (iVar3._M_current ==
          (result->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::
        _M_realloc_insert<llvm::StringRef>(result,iVar3,&local_50);
      }
      else {
        (iVar3._M_current)->Data = local_50.Data;
        (iVar3._M_current)->Length = local_50.Length;
        ppSVar1 = &(result->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppSVar1 = *ppSVar1 + 1;
      }
      pbVar4 = pbVar4 + 1;
    } while (pbVar4 != pbVar2);
  }
  local_50.Data = "-emit-dependencies";
  local_50.Length = 0x12;
  iVar3._M_current =
       (result->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar3._M_current ==
      (result->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::
    _M_realloc_insert<llvm::StringRef>(result,iVar3,&local_50);
    iVar3._M_current =
         (result->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    (iVar3._M_current)->Data = "-emit-dependencies";
    (iVar3._M_current)->Length = 0x12;
    iVar3._M_current =
         (result->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (result->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  if ((this->moduleOutputPath)._M_string_length != 0) {
    local_50.Data = "-emit-module";
    local_50.Length = 0xc;
    if (iVar3._M_current ==
        (result->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::
      _M_realloc_insert<llvm::StringRef>(result,iVar3,&local_50);
      iVar3._M_current =
           (result->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
           super__Vector_impl_data._M_finish;
    }
    else {
      (iVar3._M_current)->Data = "-emit-module";
      (iVar3._M_current)->Length = 0xc;
      iVar3._M_current =
           (result->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
           super__Vector_impl_data._M_finish + 1;
      (result->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
      super__Vector_impl_data._M_finish = iVar3._M_current;
    }
    local_50.Data = "-emit-module-path";
    local_50.Length = 0x11;
    if (iVar3._M_current ==
        (result->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::
      _M_realloc_insert<llvm::StringRef>(result,iVar3,&local_50);
      iVar3._M_current =
           (result->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
           super__Vector_impl_data._M_finish;
    }
    else {
      (iVar3._M_current)->Data = "-emit-module-path";
      (iVar3._M_current)->Length = 0x11;
      iVar3._M_current =
           (result->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
           super__Vector_impl_data._M_finish + 1;
      (result->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
      super__Vector_impl_data._M_finish = iVar3._M_current;
    }
    local_50.Data = (this->moduleOutputPath)._M_dataplus._M_p;
    local_50.Length = (this->moduleOutputPath)._M_string_length;
    if (iVar3._M_current ==
        (result->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::
      _M_realloc_insert<llvm::StringRef>(result,iVar3,&local_50);
      iVar3._M_current =
           (result->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
           super__Vector_impl_data._M_finish;
    }
    else {
      (iVar3._M_current)->Data = local_50.Data;
      (iVar3._M_current)->Length = local_50.Length;
      iVar3._M_current =
           (result->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
           super__Vector_impl_data._M_finish + 1;
      (result->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
      super__Vector_impl_data._M_finish = iVar3._M_current;
    }
  }
  local_50.Data = "-output-file-map";
  local_50.Length = 0x10;
  if (iVar3._M_current ==
      (result->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::
    _M_realloc_insert<llvm::StringRef>(result,iVar3,&local_50);
    iVar3._M_current =
         (result->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    (iVar3._M_current)->Data = "-output-file-map";
    (iVar3._M_current)->Length = 0x10;
    iVar3._M_current =
         (result->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (result->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  if (iVar3._M_current ==
      (result->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<llvm::StringRef,std::allocator<llvm::StringRef>>::
    _M_realloc_insert<llvm::StringRef_const&>
              ((vector<llvm::StringRef,std::allocator<llvm::StringRef>> *)result,iVar3,&local_40);
  }
  else {
    (iVar3._M_current)->Data = local_40.Data;
    (iVar3._M_current)->Length = local_40.Length;
    ppSVar1 = &(result->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>).
               _M_impl.super__Vector_impl_data._M_finish;
    *ppSVar1 = *ppSVar1 + 1;
  }
  if (this->isLibrary == true) {
    local_50.Data = "-parse-as-library";
    local_50.Length = 0x11;
    iVar3._M_current =
         (result->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar3._M_current ==
        (result->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::
      _M_realloc_insert<llvm::StringRef>(result,iVar3,&local_50);
    }
    else {
      (iVar3._M_current)->Data = "-parse-as-library";
      (iVar3._M_current)->Length = 0x11;
      ppSVar1 = &(result->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppSVar1 = *ppSVar1 + 1;
    }
  }
  if (this->enableWholeModuleOptimization == true) {
    local_50.Data = "-whole-module-optimization";
    local_50.Length = 0x1a;
    iVar3._M_current =
         (result->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar3._M_current ==
        (result->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::
      _M_realloc_insert<llvm::StringRef>(result,iVar3,&local_50);
      iVar3._M_current =
           (result->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
           super__Vector_impl_data._M_finish;
    }
    else {
      (iVar3._M_current)->Data = "-whole-module-optimization";
      (iVar3._M_current)->Length = 0x1a;
      iVar3._M_current =
           (result->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
           super__Vector_impl_data._M_finish + 1;
      (result->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
      super__Vector_impl_data._M_finish = iVar3._M_current;
    }
    local_50.Data = "-num-threads";
    local_50.Length = 0xc;
    if (iVar3._M_current ==
        (result->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::
      _M_realloc_insert<llvm::StringRef>(result,iVar3,&local_50);
      iVar3._M_current =
           (result->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
           super__Vector_impl_data._M_finish;
    }
    else {
      (iVar3._M_current)->Data = "-num-threads";
      (iVar3._M_current)->Length = 0xc;
      iVar3._M_current =
           (result->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
           super__Vector_impl_data._M_finish + 1;
      (result->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
      super__Vector_impl_data._M_finish = iVar3._M_current;
    }
    local_50.Data = (this->numThreads)._M_dataplus._M_p;
    local_50.Length = (this->numThreads)._M_string_length;
  }
  else {
    local_50.Data = "-incremental";
    local_50.Length = 0xc;
    iVar3._M_current =
         (result->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
         super__Vector_impl_data._M_finish;
  }
  if (iVar3._M_current ==
      (result->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::
    _M_realloc_insert<llvm::StringRef>(result,iVar3,&local_50);
  }
  else {
    (iVar3._M_current)->Data = local_50.Data;
    (iVar3._M_current)->Length = local_50.Length;
    ppSVar1 = &(result->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>).
               _M_impl.super__Vector_impl_data._M_finish;
    *ppSVar1 = *ppSVar1 + 1;
  }
  local_50.Data = "-c";
  local_50.Length = 2;
  iVar3._M_current =
       (result->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar3._M_current ==
      (result->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::
    _M_realloc_insert<llvm::StringRef>(result,iVar3,&local_50);
  }
  else {
    (iVar3._M_current)->Data = "-c";
    (iVar3._M_current)->Length = 2;
    ppSVar1 = &(result->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>).
               _M_impl.super__Vector_impl_data._M_finish;
    *ppSVar1 = *ppSVar1 + 1;
  }
  pbVar4 = (this->sourcesList).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (this->sourcesList).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar4 != pbVar2) {
    do {
      local_50.Data = (pbVar4->_M_dataplus)._M_p;
      local_50.Length = pbVar4->_M_string_length;
      iVar3._M_current =
           (result->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (result->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::
        _M_realloc_insert<llvm::StringRef>(result,iVar3,&local_50);
      }
      else {
        (iVar3._M_current)->Data = local_50.Data;
        (iVar3._M_current)->Length = local_50.Length;
        ppSVar1 = &(result->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppSVar1 = *ppSVar1 + 1;
      }
      pbVar4 = pbVar4 + 1;
    } while (pbVar4 != pbVar2);
  }
  pbVar4 = (this->importPaths).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (this->importPaths).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar4 != pbVar2) {
    do {
      local_50.Data = "-I";
      local_50.Length = 2;
      iVar3._M_current =
           (result->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (result->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::
        _M_realloc_insert<llvm::StringRef>(result,iVar3,&local_50);
        iVar3._M_current =
             (result->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl
             .super__Vector_impl_data._M_finish;
      }
      else {
        (iVar3._M_current)->Data = "-I";
        (iVar3._M_current)->Length = 2;
        iVar3._M_current =
             (result->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl
             .super__Vector_impl_data._M_finish + 1;
        (result->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
        super__Vector_impl_data._M_finish = iVar3._M_current;
      }
      local_50.Data = (pbVar4->_M_dataplus)._M_p;
      local_50.Length = pbVar4->_M_string_length;
      if (iVar3._M_current ==
          (result->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::
        _M_realloc_insert<llvm::StringRef>(result,iVar3,&local_50);
      }
      else {
        (iVar3._M_current)->Data = local_50.Data;
        (iVar3._M_current)->Length = local_50.Length;
        ppSVar1 = &(result->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppSVar1 = *ppSVar1 + 1;
      }
      pbVar4 = pbVar4 + 1;
    } while (pbVar4 != pbVar2);
  }
  pbVar4 = (this->otherArgs).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (this->otherArgs).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar4 != pbVar2) {
    do {
      local_50.Data = (pbVar4->_M_dataplus)._M_p;
      local_50.Length = pbVar4->_M_string_length;
      iVar3._M_current =
           (result->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (result->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::
        _M_realloc_insert<llvm::StringRef>(result,iVar3,&local_50);
      }
      else {
        (iVar3._M_current)->Data = local_50.Data;
        (iVar3._M_current)->Length = local_50.Length;
        ppSVar1 = &(result->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppSVar1 = *ppSVar1 + 1;
      }
      pbVar4 = pbVar4 + 1;
    } while (pbVar4 != pbVar2);
  }
  return;
}

Assistant:

void constructCommandLineArgs(StringRef outputFileMapPath,
                                std::vector<StringRef>& result) const {
    result.push_back(executable);
    result.push_back("-module-name");
    result.push_back(moduleName);

    for (const auto& nameAndAlias: moduleAliases) {
      // E.g. `-module-alias Foo=Bar`
      result.push_back("-module-alias");
      result.push_back(nameAndAlias);
    }

    result.push_back("-emit-dependencies");
    if (!moduleOutputPath.empty()) {
      result.push_back("-emit-module");
      result.push_back("-emit-module-path");
      result.push_back(moduleOutputPath);
    }
    result.push_back("-output-file-map");
    result.push_back(outputFileMapPath);
    if (isLibrary) {
      result.push_back("-parse-as-library");
    }
    if (enableWholeModuleOptimization) {
      result.push_back("-whole-module-optimization");
      result.push_back("-num-threads");
      result.push_back(numThreads);
    } else {
      result.push_back("-incremental");
    }
    result.push_back("-c");
    for (const auto& source: sourcesList) {
      result.push_back(source);
    }
    for (const auto& import: importPaths) {
      result.push_back("-I");
      result.push_back(import);
    }
    for (const auto& arg: otherArgs) {
      result.push_back(arg);
    }
  }